

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O2

function<void_()> * __thiscall
Console::bindCallback<int,std::__cxx11::string>
          (function<void_()> *__return_storage_ptr__,Console *this,
          function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,int argumentIndex)

{
  int iVar1;
  const_reference s;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  nextCallback;
  undefined1 auStack_98 [32];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_78;
  anon_class_40_2_4fe94ccd local_58;
  
  s = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)callback,(long)(int)arguments);
  iVar1 = argumentConverter<int>::convert(s);
  std::
  function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_58.callback,
             (function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)this);
  local_58.value = iVar1;
  std::function<void(std::__cxx11::string)>::
  function<Console::bindCallback<int,std::__cxx11::string>(std::function<void(int,std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)::_lambda(std::__cxx11::string)_1_,void>
            ((function<void(std::__cxx11::string)> *)(auStack_98 + 0x20),&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)auStack_98,
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)(auStack_98 + 0x20));
  bindCallback<std::__cxx11::string>
            (__return_storage_ptr__,(Console *)auStack_98,
             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)callback,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(ulong)((int)arguments + 1),argumentIndex);
  std::_Function_base::~_Function_base((_Function_base *)auStack_98);
  std::_Function_base::~_Function_base((_Function_base *)(auStack_98 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::function<void()> Console::bindCallback(std::function<void(T, Args...)> callback, const std::vector<std::string> &arguments, int argumentIndex)
{
    T value = argumentConverter<T>::convert(arguments.at(argumentIndex));
    std::function<void(Args...)> nextCallback = [callback, value](Args... args) {
        callback(value, args...);
    };
    return bindCallback(nextCallback, arguments, argumentIndex + 1);
}